

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBinaryOps.cpp
# Opt level: O2

void __thiscall
rsg::ComputeSubRange::operator()
          (ComputeSubRange *this,Random *random,int dstMin,int dstMax,int *aMin,int *aMax,int *bMin,
          int *bMax)

{
  int iVar1;
  deUint32 dVar2;
  int iVar3;
  uint uVar4;
  
  iVar1 = de::Random::getInt(random,0,dstMax - dstMin);
  dVar2 = deRandom_getUint32(&random->m_rnd);
  uVar4 = dVar2 % 0x11;
  iVar3 = uVar4 + dstMin + -8;
  *aMin = iVar3;
  *aMax = iVar3 + iVar1;
  *bMin = uVar4 + (iVar1 - (dstMax - dstMin)) + -8;
  *bMax = uVar4 - 8;
  return;
}

Assistant:

void ComputeSubRange::operator() (de::Random& random, T dstMin, T dstMax, T& aMin, T& aMax, T& bMin, T& bMax) const
{
	struct GetRandom
	{
		int		operator() (de::Random& rnd, int min, int max) const		{ return rnd.getInt(min, max); }
		float	operator() (de::Random& rnd, float min, float max) const	{ return getQuantizedFloat(rnd, min, max, 0.5f); }
	};

	T rangeLen		= dstMax-dstMin;
	T subRangeLen	= GetRandom()(random, T(0), rangeLen);
	T aOffset		= GetRandom()(random, T(-8), T(8));

	aMin			= dstMin+aOffset;
	aMax			= aMin+subRangeLen;

	bMin			= aOffset-(rangeLen-subRangeLen);
	bMax			= aOffset;

#if defined(DE_DEBUG)
	T eps = T(0.001);
	DE_ASSERT(aMin <= aMax && bMin <= bMax);
	DE_ASSERT(de::inRange(aMin-bMin, dstMin-eps, dstMax+eps));
	DE_ASSERT(de::inRange(aMin-bMax, dstMin-eps, dstMax+eps));
	DE_ASSERT(de::inRange(aMax-bMin, dstMin-eps, dstMax+eps));
	DE_ASSERT(de::inRange(aMax-bMax, dstMin-eps, dstMax+eps));
#endif
}